

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O0

replay_entry_t * __thiscall replay_entry_t::next_entry(replay_entry_t *this)

{
  bool bVar1;
  replay_entry_t *entry;
  replay_entry_t *this_local;
  replay_entry_t *local_8;
  
  local_8 = this;
  if (this->m_type != ped_type_last) {
    entry = this + 1;
    while( true ) {
      bVar1 = false;
      if (entry->m_type == ped_type_orphaned) {
        bVar1 = entry->m_value == -1;
      }
      if (!bVar1) break;
      entry = entry + 1;
    }
    local_8 = entry;
  }
  return local_8;
}

Assistant:

replay_entry_t *next_entry()
    {
        replay_entry_t *entry = this;

        // You can't go beyond the end
        if (ped_type_last == entry->m_type)
            return entry;

        // Advance to the next entry
        entry++;

        // Skip any ORPHANED records that don't have a matching steal. We
        // initialized the value field to -1 for ORPHANED.  After loading all
        // the log data, we iterated through all the STEAL records setting the
        // matching ORPHANED record's value field to 0. So if an ORPHANED
        // record's value field is still -1, it doesn't have a matching STEAL
        // record, and I don't know why we chose not to return from the
        // spawned function.
        while ((ped_type_orphaned == entry->m_type) && (-1 == entry->m_value))
        {
            entry++;
        }

        return entry;
    }